

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O1

int iniparser_getnsec(dictionary *d)

{
  long lVar1;
  char **ppcVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  
  if (d == (dictionary *)0x0) {
    iVar4 = -1;
  }
  else {
    lVar1 = d->size;
    if (lVar1 < 1) {
      iVar4 = 0;
    }
    else {
      ppcVar2 = d->key;
      lVar5 = 0;
      iVar4 = 0;
      do {
        if (ppcVar2[lVar5] != (char *)0x0) {
          pcVar3 = strchr(ppcVar2[lVar5],0x3a);
          iVar4 = iVar4 + (uint)(pcVar3 == (char *)0x0);
        }
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
    }
  }
  return iVar4;
}

Assistant:

int iniparser_getnsec(const dictionary * d)
{
    int i ;
    int nsec ;

    if (d==NULL) return -1 ;
    nsec=0 ;
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        if (strchr(d->key[i], ':')==NULL) {
            nsec ++ ;
        }
    }
    return nsec ;
}